

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

int ddGroupSiftingAux(DdManager *table,int x,int xLow,int xHigh,DD_CHKFP checkFunction,int lazyFlag)

{
  DdSubtable *pDVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  DdNode *local_48;
  uint local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  
  originalSize = table->keys - table->isolated;
  local_48 = (DdNode *)0x0;
  local_40 = xLow;
  local_3c = originalSize;
  local_38 = lazyFlag;
  local_34 = xHigh;
  if (table->subtables[x].next == x) {
    uVar9 = x;
    if (xLow < x) {
      do {
        iVar5 = uVar9 - 1;
        iVar4 = (*checkFunction)(table,iVar5,uVar9);
        if (iVar4 == 0) break;
        pDVar1 = table->subtables;
        uVar8 = pDVar1[iVar5].next;
        pDVar1[iVar5].next = uVar9;
        pDVar1[x].next = uVar8;
        uVar9 = uVar8;
      } while ((int)local_40 < (int)uVar8);
    }
    uVar9 = x;
    if (x < (int)local_34) {
      do {
        uVar8 = uVar9 + 1;
        iVar5 = (*checkFunction)(table,uVar9,uVar8);
        if (iVar5 == 0) break;
        pDVar1 = table->subtables;
        uVar3 = uVar8;
        do {
          uVar2 = uVar3;
          uVar3 = pDVar1[(int)uVar2].next;
        } while (uVar2 < pDVar1[(int)uVar2].next);
        pDVar1[(int)uVar2].next = pDVar1[(int)uVar9].next;
        pDVar1[(int)uVar9].next = uVar8;
        uVar9 = uVar2;
      } while ((int)uVar2 < (int)local_34);
    }
  }
  do {
    uVar9 = x;
    x = table->subtables[(int)uVar9].next;
  } while (uVar9 < (uint)x);
  iVar5 = uVar9 - local_40;
  if (uVar9 == local_40) {
    if (local_34 == uVar9) {
      return 1;
    }
LAB_009243cf:
    iVar5 = ddGroupSiftingDown(table,uVar9,local_34,checkFunction,(Move **)&local_48);
    if (iVar5 == 0) goto LAB_00924432;
    iVar5 = 0;
  }
  else {
    iVar4 = cuddNextHigh(table,uVar9);
    if ((int)local_34 < iVar4) {
      uVar8 = table->subtables[(int)uVar9].next;
    }
    else {
      if (iVar5 <= (int)(local_34 - uVar9)) {
        uVar8 = table->subtables[(int)uVar9].next;
        iVar5 = ddGroupSiftingUp(table,uVar8,local_40,checkFunction,(Move **)&local_48);
        if (iVar5 == 0) goto LAB_00924432;
        if (local_48 != (DdNode *)0x0) {
          uVar8 = local_48->index;
        }
        do {
          uVar9 = uVar8;
          uVar8 = table->subtables[(int)uVar9].next;
        } while (uVar9 < uVar8);
        goto LAB_009243cf;
      }
      iVar5 = ddGroupSiftingDown(table,uVar9,local_34,checkFunction,(Move **)&local_48);
      if (iVar5 == 0) goto LAB_00924432;
      if (local_48 != (DdNode *)0x0) {
        uVar9 = local_48->ref;
      }
      do {
        uVar8 = table->subtables[(int)uVar9].next;
        bVar10 = uVar9 < uVar8;
        uVar9 = uVar8;
      } while (bVar10);
    }
    iVar5 = ddGroupSiftingUp(table,uVar8,local_40,checkFunction,(Move **)&local_48);
    if (iVar5 == 0) goto LAB_00924432;
    iVar5 = 1;
  }
  iVar5 = ddGroupSiftingBackward(table,(Move *)local_48,local_3c,iVar5,local_38);
  if (iVar5 != 0) {
    if (local_48 != (DdNode *)0x0) {
      pDVar7 = table->nextFree;
      do {
        pDVar6 = local_48;
        local_48 = (pDVar6->type).kids.T;
        pDVar6->ref = 0;
        pDVar6->next = pDVar7;
        pDVar7 = pDVar6;
      } while (local_48 != (DdNode *)0x0);
      table->nextFree = pDVar6;
    }
    return 1;
  }
LAB_00924432:
  if (local_48 != (DdNode *)0x0) {
    pDVar7 = table->nextFree;
    do {
      pDVar6 = local_48;
      local_48 = (pDVar6->type).kids.T;
      pDVar6->ref = 0;
      pDVar6->next = pDVar7;
      pDVar7 = pDVar6;
    } while (local_48 != (DdNode *)0x0);
    table->nextFree = pDVar6;
  }
  return 0;
}

Assistant:

static int
ddGroupSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh,
  DD_CHKFP checkFunction,
  int lazyFlag)
{
    Move *move;
    Move *moves;        /* list of moves */
    int  initialSize;
    int  result;
    int  y;
    int  topbot;

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,
                               "ddGroupSiftingAux from %d to %d\n",xLow,xHigh);
    assert((unsigned) x >= table->subtables[x].next); /* x is bottom of group */
#endif

    initialSize = table->keys - table->isolated;
    moves = NULL;

    originalSize = initialSize;         /* for lazy sifting */

    /* If we have a singleton, we check for aggregation in both
    ** directions before we sift.
    */
    if ((unsigned) x == table->subtables[x].next) {
        /* Will go down first, unless x == xHigh:
        ** Look for aggregation above x.
        */
        for (y = x; y > xLow; y--) {
            if (!checkFunction(table,y-1,y))
                break;
            topbot = table->subtables[y-1].next; /* find top of y-1's group */
            table->subtables[y-1].next = y;
            table->subtables[x].next = topbot; /* x is bottom of group so its */
                                               /* next is top of y-1's group */
            y = topbot + 1; /* add 1 for y--; new y is top of group */
        }
        /* Will go up first unless x == xlow:
        ** Look for aggregation below x.
        */
        for (y = x; y < xHigh; y++) {
            if (!checkFunction(table,y,y+1))
                break;
            /* find bottom of y+1's group */
            topbot = y + 1;
            while ((unsigned) topbot < table->subtables[topbot].next) {
                topbot = table->subtables[topbot].next;
            }
            table->subtables[topbot].next = table->subtables[y].next;
            table->subtables[y].next = y + 1;
            y = topbot - 1; /* subtract 1 for y++; new y is bottom of group */
        }
    }

    /* Now x may be in the middle of a group.
    ** Find bottom of x's group.
    */
    while ((unsigned) x < table->subtables[x].next)
        x = table->subtables[x].next;

    if (x == xLow) { /* Sift down */
#ifdef DD_DEBUG
        /* x must be a singleton */
        assert((unsigned) x == table->subtables[x].next);
#endif
        if (x == xHigh) return(1);      /* just one variable */

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (cuddNextHigh(table,x) > xHigh) { /* Sift up */
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xLow, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (x - xLow > xHigh - x) { /* must go down first: shorter */
        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* Find top of group */
        if (moves) {
            x = moves->y;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
        x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x should be the top of a group */
        assert((unsigned) x <= table->subtables[x].next);
#endif

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        if (moves) {
            x = moves->x;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x is bottom of a group */
        assert((unsigned) x >= table->subtables[x].next);
#endif

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;
    }

    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(1);

ddGroupSiftingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}